

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransporthttp.c
# Opt level: O1

_Bool abandonOrAcceptMessage
                (HTTPTRANSPORT_HANDLE_DATA *handleData,HTTPTRANSPORT_PERDEVICE_DATA *deviceData,
                char *ETag,IOTHUBMESSAGE_DISPOSITION_RESULT action)

{
  HTTPAPIEX_HANDLE pHVar1;
  HTTPAPIEX_SAS_HANDLE sasHandle;
  int iVar2;
  HTTP_HEADERS_RESULT HVar3;
  HTTPAPIEX_RESULT HVar4;
  STRING_HANDLE s1;
  size_t sVar5;
  STRING_HANDLE s2;
  LOGGER_LOG p_Var6;
  HTTP_HEADERS_HANDLE eventHTTPrequestHeaders;
  char *pcVar7;
  _Bool _Var8;
  char *s2_00;
  HTTPAPIEX_RESULT HVar9;
  uint statusCode;
  uint local_34;
  
  s1 = STRING_clone(deviceData->abandonHTTPrelativePathBegin);
  if (s1 == (STRING_HANDLE)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"abandonOrAcceptMessage",0x6bc,1,"unable to STRING_clone");
      return false;
    }
    return false;
  }
  sVar5 = strlen(ETag);
  s2 = STRING_construct_n(ETag + 1,sVar5 - 2);
  if (s2 == (STRING_HANDLE)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
      _Var8 = false;
    }
    else {
      _Var8 = false;
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"abandonOrAcceptMessage",0x6c4,1,"unable to STRING_construct_n");
    }
    goto LAB_0012cebc;
  }
  iVar2 = STRING_concat_with_STRING(s1,s2);
  if (iVar2 == 0) {
    pcVar7 = "?api-version=2016-11-14";
    if (action == IOTHUBMESSAGE_REJECTED) {
      pcVar7 = "?api-version=2016-11-14&reject";
    }
    s2_00 = "/abandon?api-version=2016-11-14";
    if (action != IOTHUBMESSAGE_ABANDONED) {
      s2_00 = pcVar7;
    }
    iVar2 = STRING_concat(s1,s2_00);
    if (iVar2 != 0) goto LAB_0012cb3a;
    eventHTTPrequestHeaders = HTTPHeaders_Alloc();
    if (eventHTTPrequestHeaders == (HTTP_HEADERS_HANDLE)0x0) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 == (LOGGER_LOG)0x0) goto LAB_0012cd89;
      pcVar7 = "unable to HTTPHeaders_Alloc";
      iVar2 = 0x6d6;
      goto LAB_0012cb69;
    }
    HVar3 = addUserAgentHeaderInfo(handleData,eventHTTPrequestHeaders);
    if (((HVar3 == HTTP_HEADERS_OK) &&
        (HVar3 = HTTPHeaders_AddHeaderNameValuePair(eventHTTPrequestHeaders,"Authorization"," "),
        HVar3 == HTTP_HEADERS_OK)) &&
       (HVar3 = HTTPHeaders_AddHeaderNameValuePair(eventHTTPrequestHeaders,"If-Match",ETag),
       HVar3 == HTTP_HEADERS_OK)) {
      local_34 = 0;
      if (deviceData->deviceSasToken == (STRING_HANDLE)0x0) {
        sasHandle = deviceData->sasObject;
        pHVar1 = handleData->httpApiExHandle;
        pcVar7 = STRING_c_str(s1);
        HVar4 = HTTPAPIEX_SAS_ExecuteRequest
                          (sasHandle,pHVar1,
                           (uint)(action != IOTHUBMESSAGE_ABANDONED) * 2 + HTTPAPI_REQUEST_POST,
                           pcVar7,eventHTTPrequestHeaders,(BUFFER_HANDLE)0x0,&local_34,
                           (HTTP_HEADERS_HANDLE)0x0,(BUFFER_HANDLE)0x0);
        HVar9 = HTTPAPIEX_OK;
        if ((HVar4 != HTTPAPIEX_OK) &&
           (p_Var6 = xlogging_get_log_function(), HVar9 = HVar4, p_Var6 != (LOGGER_LOG)0x0)) {
          pcVar7 = "unable to HTTPAPIEX_SAS_ExecuteRequest";
          iVar2 = 0x709;
LAB_0012ce0f:
          (*p_Var6)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                    ,"abandonOrAcceptMessage",iVar2,1,pcVar7);
          HVar9 = HVar4;
        }
      }
      else {
        pcVar7 = STRING_c_str(deviceData->deviceSasToken);
        HVar3 = HTTPHeaders_ReplaceHeaderNameValuePair
                          (eventHTTPrequestHeaders,"Authorization",pcVar7);
        if (HVar3 == HTTP_HEADERS_OK) {
          pHVar1 = handleData->httpApiExHandle;
          pcVar7 = STRING_c_str(s1);
          HVar4 = HTTPAPIEX_ExecuteRequest
                            (pHVar1,(uint)(action != IOTHUBMESSAGE_ABANDONED) * 2 +
                                    HTTPAPI_REQUEST_POST,pcVar7,eventHTTPrequestHeaders,
                             (BUFFER_HANDLE)0x0,&local_34,(HTTP_HEADERS_HANDLE)0x0,
                             (BUFFER_HANDLE)0x0);
          HVar9 = HTTPAPIEX_OK;
          if ((HVar4 != HTTPAPIEX_OK) &&
             (p_Var6 = xlogging_get_log_function(), HVar9 = HVar4, p_Var6 != (LOGGER_LOG)0x0)) {
            pcVar7 = "Unable to HTTPAPIEX_ExecuteRequest.";
            iVar2 = 0x6fa;
            goto LAB_0012ce0f;
          }
        }
        else {
          p_Var6 = xlogging_get_log_function();
          HVar9 = HTTPAPIEX_ERROR;
          if (p_Var6 != (LOGGER_LOG)0x0) {
            (*p_Var6)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                      ,"abandonOrAcceptMessage",0x6ed,1,"Unable to replace the old SAS Token.");
          }
        }
      }
      if (HVar9 != HTTPAPIEX_OK) goto LAB_0012ceaa;
      _Var8 = true;
      if (local_34 != 0xcc) {
        p_Var6 = xlogging_get_log_function();
        if (p_Var6 != (LOGGER_LOG)0x0) {
          pcVar7 = "unexpected status code returned %u (was expecting 204)";
          iVar2 = 0x70f;
          goto LAB_0012cd49;
        }
        goto LAB_0012ceaa;
      }
    }
    else {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        pcVar7 = "unable to HTTPHeaders_AddHeaderNameValuePair";
        iVar2 = 0x6e1;
LAB_0012cd49:
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                  ,"abandonOrAcceptMessage",iVar2,1,pcVar7);
      }
LAB_0012ceaa:
      _Var8 = false;
    }
    HTTPHeaders_Free(eventHTTPrequestHeaders);
  }
  else {
LAB_0012cb3a:
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 == (LOGGER_LOG)0x0) {
LAB_0012cd89:
      _Var8 = false;
    }
    else {
      pcVar7 = "unable to STRING_concat";
      iVar2 = 0x6ce;
LAB_0012cb69:
      _Var8 = false;
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransporthttp.c"
                ,"abandonOrAcceptMessage",iVar2,1,pcVar7);
    }
  }
  STRING_delete(s2);
LAB_0012cebc:
  STRING_delete(s1);
  return _Var8;
}

Assistant:

static bool abandonOrAcceptMessage(HTTPTRANSPORT_HANDLE_DATA* handleData, HTTPTRANSPORT_PERDEVICE_DATA* deviceData, const char* ETag, IOTHUBMESSAGE_DISPOSITION_RESULT action)
{
    bool result;
    STRING_HANDLE fullAbandonRelativePath = STRING_clone(deviceData->abandonHTTPrelativePathBegin);
    if (fullAbandonRelativePath == NULL)
    {
        LogError("unable to STRING_clone");
        result = false;
    }
    else
    {
        STRING_HANDLE ETagUnquoted = STRING_construct_n(ETag + 1, strlen(ETag) - 2); /*skip first character which is '"' and the last one (which is also '"')*/
        if (ETagUnquoted == NULL)
        {
            LogError("unable to STRING_construct_n");
            result = false;
        }
        else
        {
            if (!(
                (STRING_concat_with_STRING(fullAbandonRelativePath, ETagUnquoted) == 0) &&
                (STRING_concat(fullAbandonRelativePath, (action == IOTHUBMESSAGE_ABANDONED) ? "/abandon" API_VERSION : ((action == IOTHUBMESSAGE_REJECTED) ? API_VERSION "&reject" : API_VERSION)) == 0)
                ))
            {
                LogError("unable to STRING_concat");
                result = false;
            }
            else
            {
                HTTP_HEADERS_HANDLE abandonRequestHttpHeaders = HTTPHeaders_Alloc();
                if (abandonRequestHttpHeaders == NULL)
                {
                    LogError("unable to HTTPHeaders_Alloc");
                    result = false;
                }
                else
                {
                    if (!(
                        (addUserAgentHeaderInfo(handleData, abandonRequestHttpHeaders) == HTTP_HEADERS_OK) &&
                        (HTTPHeaders_AddHeaderNameValuePair(abandonRequestHttpHeaders, IOTHUB_AUTH_HEADER_VALUE, " ") == HTTP_HEADERS_OK) &&
                        (HTTPHeaders_AddHeaderNameValuePair(abandonRequestHttpHeaders, "If-Match", ETag) == HTTP_HEADERS_OK)
                        ))
                    {
                        LogError("unable to HTTPHeaders_AddHeaderNameValuePair");
                        result = false;
                    }
                    else
                    {
                        unsigned int statusCode = 0;
                        HTTPAPIEX_RESULT r;
                        if (deviceData->deviceSasToken != NULL)
                        {
                            if (HTTPHeaders_ReplaceHeaderNameValuePair(abandonRequestHttpHeaders, IOTHUB_AUTH_HEADER_VALUE, STRING_c_str(deviceData->deviceSasToken)) != HTTP_HEADERS_OK)
                            {
                                r = HTTPAPIEX_ERROR;
                                LogError("Unable to replace the old SAS Token.");
                            }
                            else if ((r = HTTPAPIEX_ExecuteRequest(
                                handleData->httpApiExHandle,
                                (action == IOTHUBMESSAGE_ABANDONED) ? HTTPAPI_REQUEST_POST : HTTPAPI_REQUEST_DELETE,                               /*-requestType: POST                                                                                                       */
                                STRING_c_str(fullAbandonRelativePath),              /*-relativePath: abandon relative path begin (as created by _Create) + value of ETag + "/abandon?api-version=2016-11-14"   */
                                abandonRequestHttpHeaders,                          /*- requestHttpHeadersHandle: an HTTP headers instance containing the following                                            */
                                NULL,                                               /*- requestContent: NULL                                                                                                   */
                                &statusCode,                                         /*- statusCode: a pointer to unsigned int which might be examined for logging                                              */
                                NULL,                                               /*- responseHeadearsHandle: NULL                                                                                           */
                                NULL                                                /*- responseContent: NULL]                                                                                                 */
                            )) != HTTPAPIEX_OK)
                            {
                                LogError("Unable to HTTPAPIEX_ExecuteRequest.");
                            }
                        }
                        else if ((r = HTTPAPIEX_SAS_ExecuteRequest(
                            deviceData->sasObject,
                            handleData->httpApiExHandle,
                            (action == IOTHUBMESSAGE_ABANDONED) ? HTTPAPI_REQUEST_POST : HTTPAPI_REQUEST_DELETE,                               /*-requestType: POST                                                                                                       */
                            STRING_c_str(fullAbandonRelativePath),              /*-relativePath: abandon relative path begin (as created by _Create) + value of ETag + "/abandon?api-version=2016-11-14"   */
                            abandonRequestHttpHeaders,                          /*- requestHttpHeadersHandle: an HTTP headers instance containing the following                                            */
                            NULL,                                               /*- requestContent: NULL                                                                                                   */
                            &statusCode,                                         /*- statusCode: a pointer to unsigned int which might be examined for logging                                              */
                            NULL,                                               /*- responseHeadearsHandle: NULL                                                                                           */
                            NULL                                                /*- responseContent: NULL]                                                                                                 */
                        )) != HTTPAPIEX_OK)
                        {
                            LogError("unable to HTTPAPIEX_SAS_ExecuteRequest");
                        }
                        if (r == HTTPAPIEX_OK)
                        {
                            if (statusCode != 204)
                            {
                                LogError("unexpected status code returned %u (was expecting 204)", statusCode);
                                result = false;
                            }
                            else
                            {
                                /*all is fine*/
                                result = true;
                            }
                        }
                        else
                        {
                            result = false;
                        }
                    }
                    HTTPHeaders_Free(abandonRequestHttpHeaders);
                }
            }
            STRING_delete(ETagUnquoted);
        }
        STRING_delete(fullAbandonRelativePath);
    }
    return result;
}